

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<kj::Repeat<char>,char_const*&,char,int&,char_const(&)[3],kj::String>
          (String *__return_storage_ptr__,kj *this,Repeat<char> *params,char **params_1,
          char *params_2,int *params_3,char (*params_4) [3],String *params_5)

{
  char *pcVar1;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 uVar2;
  undefined1 local_88 [16];
  Repeat<char> local_78;
  kj local_68 [8];
  undefined8 local_60;
  ArrayPtr<const_char> local_58;
  CappedArray<char,_14UL> local_48;
  
  local_68[0] = *this;
  local_60 = *(undefined8 *)(this + 8);
  pcVar1 = *(char **)params;
  local_78.count = strlen(pcVar1);
  uVar2 = *(undefined1 *)params_1;
  local_78._0_8_ = pcVar1;
  _::Stringifier::operator*(&local_48,(Stringifier *)&_::STR,*(int *)params_2);
  local_88._8_8_ = strlen((char *)params_3);
  pcVar1 = *(char **)(params_4[2] + 2);
  local_58.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_58.ptr = *(char **)params_4;
  }
  local_58.size_ = (size_t)(char *)0x0;
  if (pcVar1 != (char *)0x0) {
    local_58.size_ = (size_t)(pcVar1 + -1);
  }
  local_88._0_8_ = params_3;
  _::
  concat<kj::Repeat<char>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)local_68,&local_78,
             (ArrayPtr<const_char> *)&stack0xffffffffffffff77,(FixedArray<char,_1UL> *)&local_48,
             (CappedArray<char,_14UL> *)local_88,&local_58,
             (ArrayPtr<const_char> *)CONCAT17(uVar2,in_stack_ffffffffffffff70));
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}